

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O0

int CfdAddTapBranchByTapLeaf(void *handle,void *tree_handle,char *tapscript,uint8_t leaf_version)

{
  bool bVar1;
  byte bVar2;
  undefined8 uVar3;
  uint8_t in_CL;
  char *in_RDX;
  long in_RSI;
  CfdException *except;
  exception *std_except;
  value_type *tree;
  value_type *branch;
  TaprootScriptTree leaf;
  CfdCapiTapscriptTree *buffer;
  int result;
  size_type in_stack_fffffffffffffdb8;
  reference in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdd0;
  CfdError in_stack_fffffffffffffddc;
  uint uVar4;
  CfdException *in_stack_fffffffffffffde0;
  string local_1c0;
  reference local_1a0;
  allocator local_191;
  string local_190;
  Script local_170;
  string *in_stack_fffffffffffffec8;
  void *in_stack_fffffffffffffed0;
  allocator local_99;
  string local_98 [32];
  CfdSourceLocation local_78;
  allocator local_59;
  string local_58 [48];
  undefined4 local_28;
  uint8_t local_21;
  char *local_20;
  long local_18;
  int local_4;
  
  local_28 = 0xffffffff;
  local_21 = in_CL;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"TapscriptTree",&local_59);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_78.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_script.cpp"
                 ,0x2f);
    local_78.filename = local_78.filename + 1;
    local_78.line = 0x31a;
    local_78.funcname = "CfdAddTapBranchByTapLeaf";
    cfd::core::logger::warn<>(&local_78,"tapscript is null or empty.");
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_98,"Failed to parameter. tapscript is null or empty.",&local_99);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffddc,in_stack_fffffffffffffdd0);
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_190,local_20,&local_191);
  cfd::core::Script::Script(&local_170,&local_190);
  cfd::core::TaprootScriptTree::TaprootScriptTree
            ((TaprootScriptTree *)&stack0xfffffffffffffec8,local_21,&local_170);
  cfd::core::Script::~Script((Script *)in_stack_fffffffffffffdc0);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  bVar1 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::empty
                    (*(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
                      (local_18 + 0x18));
  if (bVar1) {
    in_stack_fffffffffffffdc0 =
         std::vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::
         at((vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_> *)
            in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    cfd::core::TaprootScriptTree::AddBranch
              (in_stack_fffffffffffffdc0,(TaprootScriptTree *)&stack0xfffffffffffffec8);
  }
  else {
    local_1a0 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at
                          ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)
                           in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    cfd::core::TapBranch::ToString_abi_cxx11_(&local_1c0,local_1a0);
    bVar2 = std::__cxx11::string::empty();
    uVar4 = (uint)bVar2 << 0x18;
    std::__cxx11::string::~string((string *)&local_1c0);
    if ((uVar4 & 0x1000000) == 0) {
      cfd::core::TapBranch::AddBranch(local_1a0,(TapBranch *)&stack0xfffffffffffffec8);
    }
    else {
      cfd::core::TapBranch::operator=(local_1a0,(TapBranch *)&stack0xfffffffffffffec8);
    }
  }
  local_4 = 0;
  cfd::core::TaprootScriptTree::~TaprootScriptTree(in_stack_fffffffffffffdc0);
  return local_4;
}

Assistant:

int CfdAddTapBranchByTapLeaf(
    void* handle, void* tree_handle, const char* tapscript,
    uint8_t leaf_version) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    if (IsEmptyString(tapscript)) {
      warn(CFD_LOG_SOURCE, "tapscript is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tapscript is null or empty.");
    }
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    TaprootScriptTree leaf(leaf_version, Script(tapscript));
    if (!buffer->branch_buffer->empty()) {
      auto& branch = buffer->branch_buffer->at(0);
      if (branch.ToString().empty()) {
        branch = leaf;  // override
      } else {
        branch.AddBranch(leaf);
      }
    } else {
      auto& tree = buffer->tree_buffer->at(0);
      tree.AddBranch(leaf);
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}